

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

void __thiscall APITests::~APITests(APITests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer pcVar3;
  
  (this->super_TestSuit)._vptr_TestSuit = (_func_int **)&PTR__APITests_0011d6d8;
  piVar2 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->all_board_pins).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->pin_data).all_pwms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->pin_data).all_pwms.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  pcVar3 = (this->pin_data).tegra_soc_pin._M_dataplus._M_p;
  paVar1 = &(this->pin_data).tegra_soc_pin.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->pin_data).cvm_pin._M_dataplus._M_p;
  paVar1 = &(this->pin_data).cvm_pin.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  piVar2 = (this->pin_data).unimplemented_pins.super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->pin_data).unimplemented_pins.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  (this->super_TestSuit)._vptr_TestSuit = (_func_int **)&PTR__TestSuit_0011d730;
  std::vector<TestFunction,_std::allocator<TestFunction>_>::~vector(&(this->super_TestSuit).tests);
  return;
}

Assistant:

static TestPinData get_test_pin_data(const std::string& model)
    {
        if (model == "JETSON_ORIN_NANO")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 15 as mux function PWM:
            busybox devmem 0x02440020 32 0x400
            Set BOARD pin 33 as mux function PWM:
            busybox devmem 0x02434040 32 0x401
            Board mode pins
            */
            return {33, 19, 11, 13, {}, "GPIO09", "GP167", {15, 33}};

        if (model == "JETSON_ORIN_NX")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 15 as mux function PWM:
            busybox devmem 0x02440020 32 0x400
            Set BOARD pin 33 as mux function PWM:
            busybox devmem 0x02434040 32 0x401
            Board mode pins */
            return {33, 19, 11, 13, {}, "GPIO09", "GP167", {15, 33}};

        if (model == "JETSON_ORIN")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 15 as mux function PWM:
            busybox devmem 0x02440020 32 0x400
            Set BOARD pin 18 as mux function PWM:
            busybox devmem 0x02434040 32 0x401
            Board mode pins */
            return {18, 19, 11, 13, {}, "MCLK05", "GP66", {15, 18}};

        if (model == "JETSON_XAVIER")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 18 as mux function PWM:
            busybox devmem 0x2434090 32 0x401 */
            return {18, 19, 21, 22, {}, "MCLK05", "SOC_GPIO42", {13, 15, 18}};

        if (model == "JETSON_TX2")
            return {18, 19, 21, 22, {26}, "AUDIO_MCLK", "AUD_MCLK", {}};

        if (model == "JETSON_TX1")
            return {18, 19, 21, 22, {}, "AUDIO_MCLK", "AUD_MCLK", {}};

        if (model == "JETSON_NANO")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 32 as mux function PWM (set bits 1:0 to 1 not 3):
            sudo busybox devmem 0x700031fc 32 0x45
            Set BOARD pin 32 as SFIO (clear bit 0):
            sudo busybox devmem 0x6000d504 32 0x2 */
            return {32, 31, 29, 26, {}, "GPIO9", "AUD_MCLK", {32, 33}};

        if (model == "JETSON_NX")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 32 as mux function PWM (func 1):
            busybox devmem 0x2430040 32 0x401
            Set BOARD pin 33 as mux function PWM (func 2):
            busybox devmem 0x2440020 32 0x402 */
            return {32, 31, 29, 26, {}, "GPIO09", "AUD_MCLK", {15, 32, 33}};

        if (model == "CLARA_AGX_XAVIER")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 18 as mux function PWM:
            busybox devmem 0x2434090 32 0x401 */
            return {18, 19, 21, 22, {}, "MCLK05", "SOC_GPIO42", {15, 18}};

        if (model == "JETSON_TX2_NX")
            /* Pre-test configuration, if boot-time pinmux doesn't set up PWM pins:
            Set BOARD pin 33 as mux function PWM (func 1):
            busybox devmem 0x0c3010a8 32 0x401
            Set BOARD pin 32 as mux function PWM (func 2):
            busybox devmem 0x0c301080 32 0x401
            Board mode pins */
            return {32, 31, 29, 26, {}, "GPIO09", "AUD_MCLK", {32, 33}};

        throw std::runtime_error("invalid model");
    }